

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HashBinGeneric.h
# Opt level: O2

TldAddressAsKey * __thiscall
BinHash<TldAddressAsKey>::Retrieve(BinHash<TldAddressAsKey> *this,TldAddressAsKey *key)

{
  bool bVar1;
  uint32_t uVar2;
  TldAddressAsKey *key_00;
  
  key_00 = (TldAddressAsKey *)0x0;
  if ((key != (TldAddressAsKey *)0x0) && (this->tableSize != 0)) {
    uVar2 = TldAddressAsKey::Hash(key);
    key_00 = (TldAddressAsKey *)(this->hashBin + (ulong)uVar2 % (ulong)this->tableSize);
    do {
      key_00 = key_00->HashNext;
      if (key_00 == (TldAddressAsKey *)0x0) {
        return (TldAddressAsKey *)0x0;
      }
      bVar1 = TldAddressAsKey::IsSameKey(key,key_00);
    } while (!bVar1);
  }
  return key_00;
}

Assistant:

KeyObj * Retrieve(KeyObj * key)
    {
        KeyObj * ret = 0;

        if (key != 0 && tableSize > 0)
        {
            uint32_t hash_index = key->Hash() % tableSize;

            ret = hashBin[hash_index];

            while (ret != NULL && !key->IsSameKey(ret))
            {
                ret = ret->HashNext;
            }
        }

        return ret;
    }